

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O3

Point3f pbrt::weightBoundary(SDVertex *vert,Float beta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  SDFace *pSVar11;
  float *pfVar12;
  float *pfVar13;
  int iVar14;
  Point3f *pPVar15;
  size_t count;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar16;
  Point3f PVar17;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  pRing;
  float local_168;
  float fStack_164;
  float local_158;
  float fStack_154;
  polymorphic_allocator<pbrt::Point3<float>_> local_118;
  Tuple3<pbrt::Point3,_float> local_110;
  undefined1 local_100 [20];
  float local_ec;
  float local_e8 [46];
  size_t local_30;
  size_t local_28;
  
  pSVar11 = vert->startFace;
  if (vert->boundary == false) {
    iVar14 = 0;
    do {
      pSVar11 = SDFace::nextFace(pSVar11,vert);
      iVar14 = iVar14 + 1;
    } while (pSVar11 != vert->startFace);
  }
  else {
    iVar14 = 0;
    do {
      pSVar11 = SDFace::nextFace(pSVar11,vert);
      iVar14 = iVar14 + 1;
    } while (pSVar11 != (SDFace *)0x0);
    pSVar11 = vert->startFace;
    do {
      pSVar11 = SDFace::prevFace(pSVar11,vert);
      iVar14 = iVar14 + 1;
    } while (pSVar11 != (SDFace *)0x0);
  }
  count = (size_t)iVar14;
  local_118.memoryResource = pstd::pmr::new_delete_resource();
  local_110.z = 0.0;
  local_110.x = 0.0;
  local_110.y = 0.0;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                 *)local_100,count,(Point3<float> *)&local_110,&local_118);
  pPVar15 = (Point3f *)local_100._8_8_;
  if ((Point3f *)local_100._8_8_ == (Point3f *)0x0) {
    pPVar15 = (Point3f *)(local_100 + 0x10);
  }
  SDVertex::oneRing(vert,pPVar15);
  fVar1 = (vert->p).super_Tuple3<pbrt::Point3,_float>.z;
  uVar6 = (vert->p).super_Tuple3<pbrt::Point3,_float>.x;
  uVar8 = (vert->p).super_Tuple3<pbrt::Point3,_float>.y;
  pfVar12 = &((Tuple3<pbrt::Point3,_float> *)local_100._8_8_)->y;
  pPVar15 = (Point3f *)local_100._8_8_;
  if ((Point3f *)local_100._8_8_ == (Point3f *)0x0) {
    pfVar12 = &local_ec;
    pPVar15 = (Point3f *)(local_100 + 0x10);
  }
  fVar2 = (pPVar15->super_Tuple3<pbrt::Point3,_float>).x;
  pfVar13 = &((Tuple3<pbrt::Point3,_float> *)local_100._8_8_)->z;
  if ((Point3f *)local_100._8_8_ == (Point3f *)0x0) {
    pfVar13 = local_e8;
  }
  fVar3 = *pfVar13;
  fVar4 = *pfVar12;
  uVar7 = pPVar15[count - 1].super_Tuple3<pbrt::Point3,_float>.x;
  uVar9 = pPVar15[count - 1].super_Tuple3<pbrt::Point3,_float>.y;
  fVar5 = pPVar15[count - 1].super_Tuple3<pbrt::Point3,_float>.z;
  local_28 = 0;
  (*(*(_func_int ***)local_100._0_8_)[3])(local_100._0_8_,local_100._8_8_,local_30 * 0xc,4);
  auVar10._4_4_ = in_XMM0_Db;
  auVar10._0_4_ = beta;
  auVar10._8_4_ = in_XMM0_Dc;
  auVar10._12_4_ = in_XMM0_Dd;
  auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar10,ZEXT416(0x3f800000));
  fVar16 = auVar10._0_4_;
  auVar10 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar4),0x10);
  PVar17.super_Tuple3<pbrt::Point3,_float>.x =
       fVar16 * (float)uVar6 + auVar10._0_4_ * beta + beta * (float)uVar7;
  PVar17.super_Tuple3<pbrt::Point3,_float>.y =
       fVar16 * (float)uVar8 + auVar10._4_4_ * beta + beta * (float)uVar9;
  PVar17.super_Tuple3<pbrt::Point3,_float>.z = fVar16 * fVar1 + beta * fVar3 + beta * fVar5;
  return (Point3f)PVar17.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

static Point3f weightBoundary(SDVertex *vert, Float beta) {
    // Put _vert_ one-ring in _pRing_
    int valence = vert->valence();
    InlinedVector<Point3f, 16> pRing(valence);

    vert->oneRing(pRing.data());
    Point3f p = (1 - 2 * beta) * vert->p;
    p += beta * pRing[0];
    p += beta * pRing[valence - 1];
    return p;
}